

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amha_star.hpp
# Opt level: O0

bool __thiscall
csbpl_planner::AMHAStar<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>::
run(AMHAStar<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double> *this,
   StatePtr *start_state,StatePtr *goal_state)

{
  pointer *__x;
  double *pdVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  pointer *this_00;
  double dVar3;
  double dVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  element_type *peVar8;
  element_type *peVar9;
  mapped_type *pmVar10;
  __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *p_Var11;
  reference pvVar12;
  reference pvVar13;
  size_type sVar14;
  reference psVar15;
  size_type sVar16;
  ostream *this_01;
  SearchVertexPtr *pSVar17;
  double dVar18;
  rep_conflict local_588;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_370;
  duration<long,_std::ratio<1L,_1000000000L>_> local_368;
  duration<double,_std::ratio<1L,_1L>_> local_360;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_358;
  duration<long,_std::ratio<1L,_1000000000L>_> local_350;
  duration<double,_std::ratio<1L,_1L>_> local_348;
  rep_conflict local_340;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_338;
  duration<long,_std::ratio<1L,_1000000000L>_> local_330;
  duration<double,_std::ratio<1L,_1L>_> local_328;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_320;
  duration<long,_std::ratio<1L,_1000000000L>_> local_318;
  duration<double,_std::ratio<1L,_1L>_> local_310;
  rep_conflict local_308;
  double unit_solution_time_1;
  undefined1 local_2f8 [24];
  vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
  path_1;
  shared_ptr<csbpl_common::Heap<double>::Element> local_2c0;
  __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *local_2b0;
  SearchVertexPtr *new_open_1;
  iterator __end0_3;
  iterator __begin0_3;
  vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
  *__range4_1;
  undefined1 local_280 [8];
  SearchVertexPtr open_inad_vertex;
  SearchVertexPtr incons_inad_vertex;
  shared_ptr<sliding_puzzle::SlidingPuzzleState> *incons_inad_state;
  iterator __end0_2;
  iterator __begin0_2;
  vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
  *__range4;
  vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
  open_inad_u_incons_inad;
  undefined1 local_220 [4];
  int i_2;
  shared_ptr<csbpl_common::Heap<double>::Element> local_210;
  __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *local_200;
  SearchVertexPtr *new_open;
  iterator __end0_1;
  iterator __begin0_1;
  vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
  *__range3_1;
  undefined1 local_1d0 [8];
  SearchVertexPtr open_vertex;
  SearchVertexPtr incons_vertex;
  shared_ptr<sliding_puzzle::SlidingPuzzleState> *incons_state;
  iterator __end0;
  iterator __begin0;
  vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
  *__range3;
  vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
  open_u_incons;
  duration<long,_std::ratio<1L,_1000000000L>_> local_170;
  duration<double,_std::ratio<1L,_1L>_> local_168;
  double local_160;
  double time_elapsed;
  duration<long,_std::ratio<1L,_1000000000L>_> local_150;
  duration<double,_std::ratio<1L,_1L>_> local_148;
  rep_conflict local_140;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_138;
  duration<long,_std::ratio<1L,_1000000000L>_> local_130;
  duration<double,_std::ratio<1L,_1L>_> local_128;
  rep_conflict local_120;
  double unit_solution_time;
  undefined1 local_110 [24];
  vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
  path;
  undefined1 local_e0 [8];
  SearchVertexPtr vertex_copy_1;
  undefined1 local_c8 [4];
  int i_1;
  shared_ptr<csbpl_common::Heap<double>::Element> local_b8;
  shared_ptr<csbpl_common::Heap<double>::Element> local_a8;
  undefined1 local_98 [8];
  Heap<double> unit_open_inad;
  SearchVertexPtr vertex_copy;
  undefined1 local_68 [4];
  int i;
  shared_ptr<csbpl_common::Heap<double>::Element> local_48;
  shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_> local_38;
  StatePtr *local_28;
  StatePtr *goal_state_local;
  StatePtr *start_state_local;
  AMHAStar<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double> *this_local;
  
  local_28 = goal_state;
  goal_state_local = start_state;
  start_state_local = (StatePtr *)this;
  std::
  make_shared<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,double>,std::shared_ptr<sliding_puzzle::SlidingPuzzleState>&>
            ((shared_ptr<sliding_puzzle::SlidingPuzzleState> *)&local_38);
  pSVar17 = &(this->
             super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
             ).start_vertex_;
  std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>::operator=
            (pSVar17,&local_38);
  std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>::~shared_ptr
            (&local_38);
  peVar8 = std::
           __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)pSVar17);
  std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>::operator=
            (&peVar8->self_ptr_,pSVar17);
  peVar8 = std::
           __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)pSVar17);
  peVar8->g_cost_ = 0.0;
  peVar8 = std::
           __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)pSVar17);
  peVar8->root_id_ = 1;
  peVar8 = std::
           __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)pSVar17);
  peVar8->depth_ = 0;
  peVar9 = std::
           __shared_ptr_access<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->
                            super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                            ).env_ptr_);
  pmVar10 = std::
            unordered_map<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_sliding_puzzle::SlidingPuzzleState::Compare,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>_>
            ::operator[](&peVar9->explored_,goal_state_local);
  std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>::operator=
            (pmVar10,pSVar17);
  std::shared_ptr<csbpl_common::Heap<double>::Element>::
  shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,double>,void>
            (&local_48,pSVar17);
  csbpl_common::Heap<double>::insert
            (&(this->
              super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
              ).open_,&local_48);
  std::shared_ptr<csbpl_common::Heap<double>::Element>::~shared_ptr(&local_48);
  std::shared_ptr<csbpl_common::Heap<double>::Element>::
  shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,double>,void>
            ((shared_ptr<csbpl_common::Heap<double>::Element> *)local_68,
             &(this->
              super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
              ).start_vertex_);
  csbpl_common::Heap<double>::decreaseKey
            (&(this->
              super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
              ).open_,(shared_ptr<csbpl_common::Heap<double>::Element> *)local_68,0.0);
  std::shared_ptr<csbpl_common::Heap<double>::Element>::~shared_ptr
            ((shared_ptr<csbpl_common::Heap<double>::Element> *)local_68);
  for (vertex_copy.
       super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi._4_4_ = 0;
      vertex_copy.
      super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._4_4_ <
      (this->
      super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>).
      params_.num_inad_;
      vertex_copy.
      super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._4_4_ =
           vertex_copy.
           super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi._4_4_ + 1) {
    __x = &unit_open_inad.data_.
           super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::
    make_shared<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,double>,std::shared_ptr<sliding_puzzle::SlidingPuzzleState>>
              ((shared_ptr<sliding_puzzle::SlidingPuzzleState> *)__x);
    peVar8 = std::
             __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&(this->
                              super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                              ).start_vertex_);
    std::
    vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
    ::push_back(&peVar8->mha_copy_,(value_type *)__x);
    pSVar17 = &(this->
               super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
               ).start_vertex_;
    peVar8 = std::
             __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)pSVar17);
    p_Var11 = (__shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)std::
                 vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                 ::operator[](&peVar8->mha_copy_,
                              (long)vertex_copy.
                                    super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi._4_4_);
    peVar8 = std::
             __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(p_Var11);
    std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>::operator=
              (&peVar8->self_ptr_,pSVar17);
    csbpl_common::Heap<double>::Heap((Heap<double> *)local_98);
    std::vector<csbpl_common::Heap<double>,_std::allocator<csbpl_common::Heap<double>_>_>::push_back
              (&this->open_inad_,(value_type *)local_98);
    pvVar12 = std::vector<csbpl_common::Heap<double>,_std::allocator<csbpl_common::Heap<double>_>_>
              ::operator[](&this->open_inad_,
                           (long)vertex_copy.
                                 super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi._4_4_);
    peVar8 = std::
             __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&(this->
                              super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                              ).start_vertex_);
    pvVar13 = std::
              vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
              ::operator[](&peVar8->mha_copy_,
                           (long)vertex_copy.
                                 super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi._4_4_);
    std::shared_ptr<csbpl_common::Heap<double>::Element>::
    shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,double>,void>
              (&local_a8,pvVar13);
    csbpl_common::Heap<double>::insert(pvVar12,&local_a8);
    std::shared_ptr<csbpl_common::Heap<double>::Element>::~shared_ptr(&local_a8);
    pvVar12 = std::vector<csbpl_common::Heap<double>,_std::allocator<csbpl_common::Heap<double>_>_>
              ::operator[](&this->open_inad_,
                           (long)vertex_copy.
                                 super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi._4_4_);
    peVar8 = std::
             __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&(this->
                              super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                              ).start_vertex_);
    pvVar13 = std::
              vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
              ::operator[](&peVar8->mha_copy_,
                           (long)vertex_copy.
                                 super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi._4_4_);
    std::shared_ptr<csbpl_common::Heap<double>::Element>::
    shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,double>,void>
              (&local_b8,pvVar13);
    csbpl_common::Heap<double>::decreaseKey(pvVar12,&local_b8,0.0);
    std::shared_ptr<csbpl_common::Heap<double>::Element>::~shared_ptr(&local_b8);
    csbpl_common::Heap<double>::~Heap((Heap<double> *)local_98);
    std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>::~shared_ptr
              ((shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_> *)
               &unit_open_inad.data_.
                super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::
  make_shared<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,double>,std::shared_ptr<sliding_puzzle::SlidingPuzzleState>&>
            ((shared_ptr<sliding_puzzle::SlidingPuzzleState> *)local_c8);
  std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>::operator=
            (&(this->
              super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
              ).goal_vertex_,
             (shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_> *)
             local_c8);
  std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>::~shared_ptr
            ((shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_> *)
             local_c8);
  peVar9 = std::
           __shared_ptr_access<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->
                            super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                            ).env_ptr_);
  pmVar10 = std::
            unordered_map<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_sliding_puzzle::SlidingPuzzleState::Compare,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>_>
            ::operator[](&peVar9->explored_,local_28);
  std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>::operator=
            (pmVar10,&(this->
                      super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                      ).goal_vertex_);
  for (vertex_copy_1.
       super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi._4_4_ = 0;
      vertex_copy_1.
      super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._4_4_ <
      (this->
      super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>).
      params_.num_inad_;
      vertex_copy_1.
      super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._4_4_ =
           vertex_copy_1.
           super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi._4_4_ + 1) {
    std::
    make_shared<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,double>,std::shared_ptr<sliding_puzzle::SlidingPuzzleState>&>
              ((shared_ptr<sliding_puzzle::SlidingPuzzleState> *)local_e0);
    peVar8 = std::
             __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&(this->
                              super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                              ).goal_vertex_);
    std::
    vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
    ::push_back(&peVar8->mha_copy_,(value_type *)local_e0);
    peVar8 = std::
             __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&(this->
                              super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                              ).goal_vertex_);
    p_Var11 = (__shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)std::
                 vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                 ::operator[](&peVar8->mha_copy_,
                              (long)vertex_copy_1.
                                    super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi._4_4_);
    peVar8 = std::
             __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(p_Var11);
    std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>::operator=
              (&peVar8->self_ptr_,
               &(this->
                super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                ).goal_vertex_);
    std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>::~shared_ptr
              ((shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_> *)
               local_e0);
  }
  path.
  super__Vector_base<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::chrono::_V2::system_clock::now();
  (this->super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>).
  params_.start_time_.__d.__r =
       (rep)path.
            super__Vector_base<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
  uVar6 = (*(this->
            super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
            )._vptr_Dijkstra[4])();
  if ((uVar6 & 1) != 0) {
    std::
    __shared_ptr_access<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)&(this->
                   super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                   ).env_ptr_);
    sliding_puzzle::SlidingPuzzle::getGoalState((SlidingPuzzle *)local_110);
    Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>::
    backtrackPath((vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
                   *)(local_110 + 0x10),
                  &this->
                   super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                  ,(StatePtr *)local_110);
    std::shared_ptr<sliding_puzzle::SlidingPuzzleState>::~shared_ptr
              ((shared_ptr<sliding_puzzle::SlidingPuzzleState> *)local_110);
    std::
    vector<std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>,_std::allocator<std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>_>_>
    ::push_back(&(this->anytime_stats_).solution_paths_,(value_type *)(local_110 + 0x10));
    unit_solution_time =
         (this->
         super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>).
         params_.eps_ *
         (this->
         super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>).
         params_.mha_eps_;
    std::vector<double,_std::allocator<double>_>::push_back
              (&(this->anytime_stats_).solution_eps_,&unit_solution_time);
    local_138.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    local_130.__r =
         (rep)std::chrono::operator-
                        (&local_138,
                         &(this->
                          super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                          ).params_.start_time_);
    local_128.__r =
         (rep_conflict)
         std::chrono::
         duration_cast<std::chrono::duration<double,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                   (&local_130);
    local_120 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_128);
    std::vector<double,_std::allocator<double>_>::push_back
              (&(this->anytime_stats_).solution_time_,&local_120);
    time_elapsed = (double)std::chrono::_V2::system_clock::now();
    local_150.__r =
         (rep)std::chrono::operator-
                        ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                          *)&time_elapsed,
                         &(this->
                          super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                          ).params_.start_time_);
    local_148.__r =
         (rep_conflict)
         std::chrono::
         duration_cast<std::chrono::duration<double,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                   (&local_150);
    local_140 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_148);
    std::vector<double,_std::allocator<double>_>::push_back
              (&(this->anytime_stats_).cummulative_time_,&local_140);
    std::
    vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
    ::~vector((vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
               *)(local_110 + 0x10));
  }
  open_u_incons.
  super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::chrono::_V2::system_clock::now();
  local_170.__r =
       (rep)std::chrono::operator-
                      ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)&open_u_incons.
                           super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       &(this->
                        super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                        ).params_.start_time_);
  local_168.__r =
       (rep_conflict)
       std::chrono::
       duration_cast<std::chrono::duration<double,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                 (&local_170);
  local_160 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_168);
  (this->super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>).
  params_.eps_ = (this->
                 super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                 ).params_.eps_ -
                 (this->
                 super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                 ).params_.delta_eps_;
  (this->super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>).
  params_.mha_eps_ =
       (this->
       super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>).
       params_.mha_eps_ -
       (this->
       super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>).
       params_.delta_mha_eps_;
  while( true ) {
    bVar5 = false;
    if ((1.0 <= (this->
                super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                ).params_.eps_) &&
       (bVar5 = false,
       1.0 <= (this->
              super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
              ).params_.mha_eps_)) {
      bVar5 = local_160 <
              (this->
              super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
              ).params_.time_limit_;
    }
    if (!bVar5) break;
    std::
    vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
    ::vector((vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
              *)&__range3);
    __end0 = std::
             vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
             ::begin(&this->incons_);
    incons_state = (shared_ptr<sliding_puzzle::SlidingPuzzleState> *)
                   std::
                   vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
                   ::end(&this->incons_);
    while (bVar5 = __gnu_cxx::operator!=
                             (&__end0,(__normal_iterator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_*,_std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>_>
                                       *)&incons_state), bVar5) {
      psVar15 = __gnu_cxx::
                __normal_iterator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_*,_std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>_>
                ::operator*(&__end0);
      peVar9 = std::
               __shared_ptr_access<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&(this->
                                super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                                ).env_ptr_);
      pmVar10 = std::
                unordered_map<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_sliding_puzzle::SlidingPuzzleState::Compare,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>_>
                ::operator[](&peVar9->explored_,psVar15);
      p_Var2 = &open_vertex.
                super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount;
      std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>::
      shared_ptr((shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_> *)
                 p_Var2,pmVar10);
      peVar8 = std::
               __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)p_Var2);
      dVar3 = peVar8->g_cost_;
      dVar4 = (this->
              super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
              ).params_.eps_;
      peVar9 = std::
               __shared_ptr_access<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&(this->
                                super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                                ).env_ptr_);
      dVar18 = sliding_puzzle::SlidingPuzzle::getAdmissibleHeuristicCost(peVar9,psVar15);
      p_Var2 = &open_vertex.
                super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount;
      peVar8 = std::
               __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)p_Var2);
      peVar8->f_cost_ = dVar4 * dVar18 + dVar3;
      std::
      vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
      ::push_back((vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                   *)&__range3,(value_type *)p_Var2);
      std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>::
      ~shared_ptr((shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_> *)
                  &open_vertex.
                   super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_*,_std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>_>
      ::operator++(&__end0);
    }
    while (iVar7 = csbpl_common::Heap<double>::size
                             (&(this->
                               super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                               ).open_), 0 < iVar7) {
      csbpl_common::Heap<double>::remove
                ((Heap<double> *)&__range3_1,
                 (char *)&(this->
                          super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                          ).open_);
      std::
      static_pointer_cast<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,double>,csbpl_common::Heap<double>::Element>
                ((shared_ptr<csbpl_common::Heap<double>::Element> *)local_1d0);
      std::shared_ptr<csbpl_common::Heap<double>::Element>::~shared_ptr
                ((shared_ptr<csbpl_common::Heap<double>::Element> *)&__range3_1);
      peVar8 = std::
               __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_1d0);
      dVar3 = peVar8->g_cost_;
      dVar4 = (this->
              super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
              ).params_.eps_;
      peVar9 = std::
               __shared_ptr_access<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&(this->
                                super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                                ).env_ptr_);
      peVar8 = std::
               __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_1d0);
      dVar18 = sliding_puzzle::SlidingPuzzle::getAdmissibleHeuristicCost(peVar9,&peVar8->state_);
      peVar8 = std::
               __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_1d0);
      peVar8->f_cost_ = dVar4 * dVar18 + dVar3;
      std::
      vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
      ::push_back((vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                   *)&__range3,(value_type *)local_1d0);
      std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>::
      ~shared_ptr((shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_> *)
                  local_1d0);
    }
    __end0_1 = std::
               vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
               ::begin((vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                        *)&__range3);
    new_open = (SearchVertexPtr *)
               std::
               vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
               ::end((vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                      *)&__range3);
    while (bVar5 = __gnu_cxx::operator!=
                             (&__end0_1,
                              (__normal_iterator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_*,_std::vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>_>
                               *)&new_open), bVar5) {
      local_200 = (__shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)__gnu_cxx::
                     __normal_iterator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_*,_std::vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>_>
                     ::operator*(&__end0_1);
      std::shared_ptr<csbpl_common::Heap<double>::Element>::
      shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,double>,void>
                (&local_210,
                 (shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_> *)
                 local_200);
      csbpl_common::Heap<double>::insert
                (&(this->
                  super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                  ).open_,&local_210);
      std::shared_ptr<csbpl_common::Heap<double>::Element>::~shared_ptr(&local_210);
      std::shared_ptr<csbpl_common::Heap<double>::Element>::
      shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,double>,void>
                ((shared_ptr<csbpl_common::Heap<double>::Element> *)local_220,
                 (shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_> *)
                 local_200);
      peVar8 = std::
               __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(local_200);
      csbpl_common::Heap<double>::decreaseKey
                (&(this->
                  super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                  ).open_,(shared_ptr<csbpl_common::Heap<double>::Element> *)local_220,
                 peVar8->f_cost_);
      std::shared_ptr<csbpl_common::Heap<double>::Element>::~shared_ptr
                ((shared_ptr<csbpl_common::Heap<double>::Element> *)local_220);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_*,_std::vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>_>
      ::operator++(&__end0_1);
    }
    std::
    unordered_map<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_sliding_puzzle::SlidingPuzzleState::Compare,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>_>_>
    ::clear(&(this->
             super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
             ).closed_);
    for (open_inad_u_incons_inad.
         super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        open_inad_u_incons_inad.
        super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ <
        (this->
        super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>).
        params_.num_inad_;
        open_inad_u_incons_inad.
        super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             open_inad_u_incons_inad.
             super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
      std::
      vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
      ::vector((vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                *)&__range4);
      sVar16 = std::vector<csbpl_common::Heap<double>,_std::allocator<csbpl_common::Heap<double>_>_>
               ::size(&this->open_inad_);
      sVar14 = std::
               vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
               ::size(&this->incons_inad_);
      std::
      vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
      ::reserve((vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                 *)&__range4,sVar16 + sVar14);
      __end0_2 = std::
                 vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
                 ::begin(&this->incons_inad_);
      incons_inad_state =
           (shared_ptr<sliding_puzzle::SlidingPuzzleState> *)
           std::
           vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
           ::end(&this->incons_inad_);
      while (bVar5 = __gnu_cxx::operator!=
                               (&__end0_2,
                                (__normal_iterator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_*,_std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>_>
                                 *)&incons_inad_state), bVar5) {
        psVar15 = __gnu_cxx::
                  __normal_iterator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_*,_std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>_>
                  ::operator*(&__end0_2);
        peVar9 = std::
                 __shared_ptr_access<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&(this->
                                  super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                                  ).env_ptr_);
        pmVar10 = std::
                  unordered_map<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_sliding_puzzle::SlidingPuzzleState::Compare,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>_>
                  ::operator[](&peVar9->explored_,psVar15);
        p_Var2 = &open_inad_vertex.
                  super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount;
        std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>::
        shared_ptr((shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_> *
                   )p_Var2,pmVar10);
        peVar8 = std::
                 __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)p_Var2);
        dVar3 = peVar8->g_cost_;
        dVar4 = (this->
                super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                ).params_.eps_;
        peVar9 = std::
                 __shared_ptr_access<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&(this->
                                  super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                                  ).env_ptr_);
        dVar18 = sliding_puzzle::SlidingPuzzle::getInadmissibleHeuristicCost
                           (peVar9,psVar15,
                            open_inad_u_incons_inad.
                            super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        p_Var2 = &open_inad_vertex.
                  super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount;
        peVar8 = std::
                 __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)p_Var2);
        p_Var11 = (__shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)std::
                     vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                     ::operator[](&peVar8->mha_copy_,
                                  (long)open_inad_u_incons_inad.
                                        super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        peVar8 = std::
                 __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(p_Var11);
        peVar8->f_cost_ = dVar4 * dVar18 + dVar3;
        peVar8 = std::
                 __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)p_Var2);
        pvVar13 = std::
                  vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                  ::operator[](&peVar8->mha_copy_,
                               (long)open_inad_u_incons_inad.
                                     super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        std::
        vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
        ::push_back((vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                     *)&__range4,pvVar13);
        std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>::
        ~shared_ptr((shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>
                     *)&open_inad_vertex.
                        super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_*,_std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>_>
        ::operator++(&__end0_2);
      }
      while( true ) {
        pvVar12 = std::
                  vector<csbpl_common::Heap<double>,_std::allocator<csbpl_common::Heap<double>_>_>::
                  operator[](&this->open_inad_,
                             (long)open_inad_u_incons_inad.
                                   super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        iVar7 = csbpl_common::Heap<double>::size(pvVar12);
        if (iVar7 < 1) break;
        pvVar12 = std::
                  vector<csbpl_common::Heap<double>,_std::allocator<csbpl_common::Heap<double>_>_>::
                  operator[](&this->open_inad_,
                             (long)open_inad_u_incons_inad.
                                   super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        csbpl_common::Heap<double>::remove((Heap<double> *)&__range4_1,(char *)pvVar12);
        std::
        static_pointer_cast<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,double>,csbpl_common::Heap<double>::Element>
                  ((shared_ptr<csbpl_common::Heap<double>::Element> *)local_280);
        std::shared_ptr<csbpl_common::Heap<double>::Element>::~shared_ptr
                  ((shared_ptr<csbpl_common::Heap<double>::Element> *)&__range4_1);
        peVar8 = std::
                 __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_280);
        peVar8 = std::
                 __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&peVar8->self_ptr_);
        dVar3 = peVar8->g_cost_;
        dVar4 = (this->
                super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                ).params_.eps_;
        peVar9 = std::
                 __shared_ptr_access<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&(this->
                                  super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                                  ).env_ptr_);
        peVar8 = std::
                 __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_280);
        dVar18 = sliding_puzzle::SlidingPuzzle::getInadmissibleHeuristicCost
                           (peVar9,&peVar8->state_,
                            open_inad_u_incons_inad.
                            super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        peVar8 = std::
                 __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_280);
        peVar8->f_cost_ = dVar4 * dVar18 + dVar3;
        std::
        vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
        ::push_back((vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                     *)&__range4,(value_type *)local_280);
        std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>::
        ~shared_ptr((shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>
                     *)local_280);
      }
      __end0_3 = std::
                 vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                 ::begin((vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                          *)&__range4);
      new_open_1 = (SearchVertexPtr *)
                   std::
                   vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                   ::end((vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                          *)&__range4);
      while (bVar5 = __gnu_cxx::operator!=
                               (&__end0_3,
                                (__normal_iterator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_*,_std::vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>_>
                                 *)&new_open_1), bVar5) {
        local_2b0 = (__shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)__gnu_cxx::
                       __normal_iterator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_*,_std::vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>_>
                       ::operator*(&__end0_3);
        pvVar12 = std::
                  vector<csbpl_common::Heap<double>,_std::allocator<csbpl_common::Heap<double>_>_>::
                  operator[](&this->open_inad_,
                             (long)open_inad_u_incons_inad.
                                   super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        std::shared_ptr<csbpl_common::Heap<double>::Element>::
        shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,double>,void>
                  (&local_2c0,
                   (shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_> *
                   )local_2b0);
        csbpl_common::Heap<double>::insert(pvVar12,&local_2c0);
        std::shared_ptr<csbpl_common::Heap<double>::Element>::~shared_ptr(&local_2c0);
        pvVar12 = std::
                  vector<csbpl_common::Heap<double>,_std::allocator<csbpl_common::Heap<double>_>_>::
                  operator[](&this->open_inad_,
                             (long)open_inad_u_incons_inad.
                                   super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        this_00 = &path_1.
                   super__Vector_base<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        std::shared_ptr<csbpl_common::Heap<double>::Element>::
        shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,double>,void>
                  ((shared_ptr<csbpl_common::Heap<double>::Element> *)this_00,
                   (shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_> *
                   )local_2b0);
        peVar8 = std::
                 __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(local_2b0);
        csbpl_common::Heap<double>::decreaseKey(pvVar12,(Ptr *)this_00,peVar8->f_cost_);
        std::shared_ptr<csbpl_common::Heap<double>::Element>::~shared_ptr
                  ((shared_ptr<csbpl_common::Heap<double>::Element> *)
                   &path_1.
                    super__Vector_base<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_*,_std::vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>_>
        ::operator++(&__end0_3);
      }
      std::
      vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
      ::~vector((vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                 *)&__range4);
    }
    std::
    unordered_map<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_sliding_puzzle::SlidingPuzzleState::Compare,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>_>_>
    ::clear(&this->closed_inad_);
    uVar6 = (*(this->
              super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
              )._vptr_Dijkstra[4])();
    if ((uVar6 & 1) != 0) {
      std::
      __shared_ptr_access<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)&(this->
                     super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                     ).env_ptr_);
      sliding_puzzle::SlidingPuzzle::getGoalState((SlidingPuzzle *)local_2f8);
      Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>::
      backtrackPath((vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
                     *)(local_2f8 + 0x10),
                    &this->
                     super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                    ,(StatePtr *)local_2f8);
      std::shared_ptr<sliding_puzzle::SlidingPuzzleState>::~shared_ptr
                ((shared_ptr<sliding_puzzle::SlidingPuzzleState> *)local_2f8);
      std::
      vector<std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>,_std::allocator<std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>_>_>
      ::push_back(&(this->anytime_stats_).solution_paths_,(value_type *)(local_2f8 + 0x10));
      unit_solution_time_1 =
           (this->
           super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
           ).params_.eps_ *
           (this->
           super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
           ).params_.mha_eps_;
      std::vector<double,_std::allocator<double>_>::push_back
                (&(this->anytime_stats_).solution_eps_,&unit_solution_time_1);
      sVar16 = std::vector<double,_std::allocator<double>_>::size
                         (&(this->anytime_stats_).solution_time_);
      if (sVar16 == 0) {
        local_320.__d.__r = (duration)std::chrono::_V2::system_clock::now();
        local_318.__r =
             (rep)std::chrono::operator-
                            (&local_320,
                             &(this->
                              super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                              ).params_.start_time_);
        local_310.__r =
             (rep_conflict)
             std::chrono::
             duration_cast<std::chrono::duration<double,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                       (&local_318);
        local_588 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_310);
      }
      else {
        local_338.__d.__r = (duration)std::chrono::_V2::system_clock::now();
        local_330.__r =
             (rep)std::chrono::operator-
                            (&local_338,
                             &(this->
                              super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                              ).params_.start_time_);
        local_328.__r =
             (rep_conflict)
             std::chrono::
             duration_cast<std::chrono::duration<double,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                       (&local_330);
        local_588 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_328);
        local_588 = local_588 - local_160;
      }
      local_308 = local_588;
      std::vector<double,_std::allocator<double>_>::push_back
                (&(this->anytime_stats_).solution_time_,&local_308);
      local_358.__d.__r = (duration)std::chrono::_V2::system_clock::now();
      local_350.__r =
           (rep)std::chrono::operator-
                          (&local_358,
                           &(this->
                            super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                            ).params_.start_time_);
      local_348.__r =
           (rep_conflict)
           std::chrono::
           duration_cast<std::chrono::duration<double,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                     (&local_350);
      local_340 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_348);
      std::vector<double,_std::allocator<double>_>::push_back
                (&(this->anytime_stats_).cummulative_time_,&local_340);
      std::
      vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
      ::~vector((vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
                 *)(local_2f8 + 0x10));
    }
    (this->super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
    ).params_.eps_ =
         (this->
         super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>).
         params_.eps_ -
         (this->
         super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>).
         params_.delta_eps_;
    (this->super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
    ).params_.mha_eps_ =
         (this->
         super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>).
         params_.mha_eps_ -
         (this->
         super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>).
         params_.delta_mha_eps_;
    local_370.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    local_368.__r =
         (rep)std::chrono::operator-
                        (&local_370,
                         &(this->
                          super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                          ).params_.start_time_);
    local_360.__r =
         (rep_conflict)
         std::chrono::
         duration_cast<std::chrono::duration<double,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                   (&local_368);
    local_160 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_360);
    std::
    vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
    ::~vector((vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
               *)&__range3);
  }
  pdVar1 = &(this->
            super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
            ).params_.time_limit_;
  if ((local_160 < *pdVar1 || local_160 == *pdVar1) ||
     (sVar16 = std::
               vector<std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>,_std::allocator<std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>_>_>
               ::size(&(this->anytime_stats_).solution_paths_), sVar16 != 0)) {
    this_local._7_1_ = true;
  }
  else {
    this_01 = std::operator<<((ostream *)&std::cout,
                              "[AMHAStar::run] Time limit exceeded and no solution found... Exiting!"
                             );
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

virtual bool run(StatePtr& start_state,
                     StatePtr& goal_state)
    {
      
      this->start_vertex_ = std::make_shared<SearchVertex>(start_state);
      this->start_vertex_->self_ptr_ = this->start_vertex_;
      this->start_vertex_->g_cost_ = 0;
      this->start_vertex_->root_id_ = 1;
      this->start_vertex_->depth_ = 0;
      this->env_ptr_->explored_[start_state] = this->start_vertex_;
      
      this->open_.insert(this->start_vertex_);
      this->open_.decreaseKey(this->start_vertex_, 0.0);
      
      for (int i=0; i<this->params_.num_inad_; ++i)
      {
        // Duplicating vertex
        // @FIXME Why am I using std::move() here?
        SearchVertexPtr vertex_copy = std::make_shared<SearchVertex>(std::move(start_state));
        this->start_vertex_->mha_copy_.push_back(vertex_copy);
        this->start_vertex_->mha_copy_[i]->self_ptr_ = this->start_vertex_;
        
        csbpl_common::Heap<HeapValueType> unit_open_inad;
        open_inad_.push_back(unit_open_inad);
        
        open_inad_[i].insert(this->start_vertex_->mha_copy_[i]);
        open_inad_[i].decreaseKey(this->start_vertex_->mha_copy_[i], 0.0);
      }
      
      this->goal_vertex_ = std::make_shared<SearchVertex>(goal_state);
      this->env_ptr_->explored_[goal_state] = this->goal_vertex_;
      for (int i=0; i<this->params_.num_inad_; ++i)
      {
        SearchVertexPtr vertex_copy = std::make_shared<SearchVertex>(goal_state);
        this->goal_vertex_->mha_copy_.push_back(vertex_copy);
        this->goal_vertex_->mha_copy_[i]->self_ptr_ = this->goal_vertex_;
      }
      
      // Start timer
      this->params_.start_time_ = Clock::now();
      
//      Suboptimality bound on current solution
//      @TODO Report the tigher suboptimality as done in the ARA Star paper.
//      for (const auto& incons_node: incons_)
//      {
//        double f_incons = this->env_ptr_->explored_[incons_node]->g_cost_ +
//          this->params_.eps_*this->env_ptr_->getAdmissibleHeuristicCost(incons_node);
//      }
      
      if (improvePath())
      {
        std::vector<StatePtr> path =
          this->backtrackPath(this->env_ptr_->getGoalState());
        anytime_stats_.solution_paths_.push_back(path);
        anytime_stats_.solution_eps_.push_back(this->params_.eps_*this->params_.mha_eps_);
        double unit_solution_time =
          duration_cast<duration<double> >(Clock::now() -
                                           this->params_.start_time_).count();
        anytime_stats_.solution_time_.push_back(unit_solution_time);
        anytime_stats_.cummulative_time_.push_back(duration_cast<duration<double> >(Clock::now() -
                                                                                    this->params_.start_time_).count());
      }
      
      double time_elapsed =
        duration_cast<duration<double> >(Clock::now() -
                                         this->params_.start_time_).count();
      
      // Updating w1 and w2
      this->params_.eps_ -= this->params_.delta_eps_;
      this->params_.mha_eps_ -= this->params_.delta_mha_eps_;
      
      // Outer loop
      while (this->params_.eps_ >= 1 &&
             this->params_.mha_eps_ >= 1 &&
             time_elapsed < this->params_.time_limit_)
      {
        // OPEN U INCONS and clearing CLOSED
        std::vector<SearchVertexPtr> open_u_incons;
        for (const auto& incons_state: incons_)
        {
          SearchVertexPtr incons_vertex = this->env_ptr_->explored_[incons_state];
          incons_vertex->f_cost_ = incons_vertex->g_cost_ +
                                   this->params_.eps_*this->env_ptr_->getAdmissibleHeuristicCost(incons_state);
          open_u_incons.push_back(incons_vertex);
        }
        while (this->open_.size() > 0)
        {
          SearchVertexPtr open_vertex =
            std::static_pointer_cast<SearchVertex>(this->open_.remove());
          open_vertex->f_cost_ = open_vertex->g_cost_ +
                                 this->params_.eps_*this->env_ptr_->getAdmissibleHeuristicCost(open_vertex->state_);
          open_u_incons.push_back(open_vertex);
        }
        
        for (const SearchVertexPtr& new_open : open_u_incons)
        {
          this->open_.insert(new_open);
          this->open_.decreaseKey(new_open,
                                  new_open->f_cost_);
        }
        
        this->closed_.clear();
        
        
        // OPEN_INAD U INCONS_INAD and clearing CLOSED_INAD
        for (int i=0; i<this->params_.num_inad_; ++i)
        {
          std::vector<SearchVertexPtr> open_inad_u_incons_inad;
          open_inad_u_incons_inad.reserve(open_inad_.size()+incons_inad_.size());
          for (const auto& incons_inad_state: incons_inad_)
          {
            SearchVertexPtr incons_inad_vertex = this->env_ptr_->explored_[incons_inad_state];
            incons_inad_vertex->mha_copy_[i]->f_cost_ = incons_inad_vertex->g_cost_ +
                                                        this->params_.eps_ *
                                                        this->env_ptr_->getInadmissibleHeuristicCost(incons_inad_state, i);
            open_inad_u_incons_inad.push_back(incons_inad_vertex->mha_copy_[i]);
          }
          while (open_inad_[i].size() > 0)
          {
            SearchVertexPtr open_inad_vertex =
              std::static_pointer_cast<SearchVertex>(open_inad_[i].remove());
            open_inad_vertex->f_cost_ = open_inad_vertex->self_ptr_->g_cost_ +
                                        this->params_.eps_ *
                                        this->env_ptr_->getInadmissibleHeuristicCost(open_inad_vertex->state_, i);
            open_inad_u_incons_inad.push_back(open_inad_vertex);
          }
          
          for (const SearchVertexPtr& new_open : open_inad_u_incons_inad)
          {
            open_inad_[i].insert(new_open);
            open_inad_[i].decreaseKey(new_open,
                                      new_open->f_cost_);
          }
        }
        
        closed_inad_.clear();
        
        if (improvePath())
        {
          std::vector<StatePtr> path =
            this->backtrackPath(this->env_ptr_->getGoalState());
          anytime_stats_.solution_paths_.push_back(path);
          anytime_stats_.solution_eps_.push_back(this->params_.eps_*this->params_.mha_eps_);
          double unit_solution_time = anytime_stats_.solution_time_.size()==0?
                                      duration_cast<duration<double> >(Clock::now() -
                                                                       this->params_.start_time_).count():
                                      duration_cast<duration<double> >(Clock::now() -
                                                                       this->params_.start_time_).count() -
                                      time_elapsed;
          anytime_stats_.solution_time_.push_back(unit_solution_time);
          anytime_stats_.cummulative_time_.push_back(duration_cast<duration<double> >(Clock::now() -
                                                                                      this->params_.start_time_).count());
        }
        
        // Epsilon update
        this->params_.eps_ -= this->params_.delta_eps_;
        this->params_.mha_eps_ -= this->params_.delta_mha_eps_;
        
        // Time elapsed update
        time_elapsed =
          duration_cast<duration<double> >(Clock::now() -
                                           this->params_.start_time_).count();
        
      }
      
      if (time_elapsed > this->params_.time_limit_ &&
          anytime_stats_.solution_paths_.size()==0)
      {
        std::cout << "[AMHAStar::run] Time limit exceeded and"
                     " no solution found... Exiting!" << std::endl;
        return false;
      }
      
      return true;
      
    }